

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

void __thiscall
embree::SceneGraph::SpotLight::SpotLight
          (SpotLight *this,Vec3fa *P,Vec3fa *D,Vec3fa *I,float angleMin,float angleMax)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Light *in_RDI;
  LightType in_XMM0_Da;
  LightType in_XMM1_Da;
  
  Light::Light(in_RDI,LIGHT_SPOT);
  uVar1 = in_RSI[1];
  *(undefined8 *)(in_RDI + 4) = *in_RSI;
  *(undefined8 *)(in_RDI + 6) = uVar1;
  uVar1 = in_RDX[1];
  *(undefined8 *)(in_RDI + 8) = *in_RDX;
  *(undefined8 *)(in_RDI + 10) = uVar1;
  uVar1 = in_RCX[1];
  *(undefined8 *)(in_RDI + 0xc) = *in_RCX;
  *(undefined8 *)(in_RDI + 0xe) = uVar1;
  in_RDI[0x10].type = in_XMM0_Da;
  in_RDI[0x11].type = in_XMM1_Da;
  return;
}

Assistant:

SpotLight (const Vec3fa& P, const Vec3fa& D, const Vec3fa& I, float angleMin, float angleMax)
        : Light(LIGHT_SPOT), P(P), D(D), I(I), angleMin(angleMin), angleMax(angleMax) {}